

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O3

void createVars(vec<vec<IntVar_*>_> *x,int n,int m,int min,int max,bool el)

{
  IntVar *pIVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  vec<vec<IntVar_*>_>::growTo(x,n);
  if (0 < n) {
    uVar4 = 0;
    do {
      lVar3 = uVar4 * 0x10;
      vec<IntVar_*>::growTo((vec<IntVar_*> *)(*(long *)(x + 8) + lVar3),m);
      if (0 < m) {
        uVar2 = 0;
        do {
          pIVar1 = newIntVar(min,max);
          *(IntVar **)(*(long *)(*(long *)(x + 8) + 8 + lVar3) + uVar2 * 8) = pIVar1;
          if (el) {
            IntVar::specialiseToEL
                      (*(IntVar **)(*(long *)(*(long *)(x + 8) + 8 + lVar3) + uVar2 * 8));
          }
          uVar2 = uVar2 + 1;
        } while ((uint)m != uVar2);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)n);
  }
  return;
}

Assistant:

void createVars(vec<vec<IntVar*> >& x, int n, int m, int min, int max, bool el) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i].growTo(m);
		for (int j = 0; j < m; j++) {
			x[i][j] = newIntVar(min, max);
			if (el) {
				x[i][j]->specialiseToEL();
			}
		}
	}
}